

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_sink-inl.h
# Opt level: O0

void __thiscall
spdlog::sinks::base_sink<spdlog::details::null_mutex>::set_pattern_
          (base_sink<spdlog::details::null_mutex> *this,string *pattern)

{
  unique_ptr<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000078;
  unique_ptr<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>_> *__u;
  unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *in_stack_ffffffffffffffd0;
  unique_ptr<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>_>
  local_18 [3];
  
  details::make_unique<spdlog::pattern_formatter,std::__cxx11::string_const&>(in_stack_00000078);
  __u = local_18;
  std::unique_ptr<spdlog::formatter,std::default_delete<spdlog::formatter>>::
  unique_ptr<spdlog::pattern_formatter,std::default_delete<spdlog::pattern_formatter>,void>
            (in_stack_ffffffffffffffd0,__u);
  (**(code **)&((in_RDI->_M_t).
                super___uniq_ptr_impl<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>_>
                ._M_t.
                super__Tuple_impl<0UL,_spdlog::pattern_formatter_*,_std::default_delete<spdlog::pattern_formatter>_>
                .super__Head_base<0UL,_spdlog::pattern_formatter_*,_false>._M_head_impl)->
               pattern_time_type_)(in_RDI,__u);
  std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::~unique_ptr
            (in_stack_ffffffffffffffd0);
  std::unique_ptr<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>_>::
  ~unique_ptr(in_RDI);
  return;
}

Assistant:

void SPDLOG_INLINE spdlog::sinks::base_sink<Mutex>::set_pattern_(const std::string &pattern)
{
    set_formatter_(details::make_unique<spdlog::pattern_formatter>(pattern));
}